

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchMan.c
# Opt level: O3

void Dch_ManPrintStats(Dch_Man_t *p)

{
  Dch_Pars_t *pDVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int level;
  double dVar6;
  double dVar7;
  
  level = (int)p;
  pDVar1 = p->pPars;
  uVar4 = (p->pAigTotal->nObjs[6] + p->pAigTotal->nObjs[5]) / 3;
  Abc_Print(level,"Parameters: Sim words = %d. Conf limit = %d. SAT var max = %d.\n",
            (ulong)(uint)pDVar1->nWords,(ulong)(uint)pDVar1->nBTLimit,
            (ulong)(uint)pDVar1->nSatVarMax);
  uVar5 = p->pAigTotal->nObjs[6] + p->pAigTotal->nObjs[5];
  Abc_Print(level,"AIG nodes : Total = %6d. Dangling = %6d. Main = %6d. (%6.2f %%)\n",
            ((double)(int)uVar4 * 100.0) / (double)(int)uVar5,(ulong)uVar5,(ulong)(uVar5 - uVar4),
            (ulong)uVar4);
  Abc_Print(level,"SAT solver: Vars = %d. Max cone = %d. Recycles = %d.\n",(ulong)(uint)p->nSatVars,
            (ulong)(uint)p->nConeMax,(ulong)(uint)p->nRecycles);
  Abc_Print(level,"SAT calls : All = %6d. Unsat = %6d. Sat = %6d. Fail = %6d.\n",
            (ulong)(uint)p->nSatCalls,
            (ulong)(uint)((p->nSatCalls - p->nSatCallsSat) - p->nSatFailsReal));
  Abc_Print(level,"Choices   : Lits = %6d. Reprs = %5d. Equivs = %5d. Choices = %5d.\n",
            (ulong)(uint)p->nLits,(ulong)(uint)p->nReprs,(ulong)(uint)p->nEquivs,
            (ulong)(uint)p->nChoices);
  Abc_Print(level,"Choicing runtime statistics:\n");
  lVar2 = p->timeSimInit;
  lVar3 = p->timeTotal;
  p->timeOther = lVar3 - (p->timeSimSat + lVar2 + p->timeSat + p->timeChoice);
  Abc_Print(level,"%s =","Sim init   ");
  dVar6 = (double)lVar2;
  dVar7 = 0.0;
  if (lVar3 != 0) {
    dVar7 = (dVar6 * 100.0) / (double)lVar3;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar6 / 1000000.0,dVar7);
  lVar2 = p->timeTotal;
  lVar3 = p->timeSimSat;
  Abc_Print(level,"%s =","Sim SAT    ");
  dVar6 = 0.0;
  if (lVar2 != 0) {
    dVar6 = ((double)lVar3 * 100.0) / (double)lVar2;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)lVar3 / 1000000.0,dVar6);
  lVar2 = p->timeTotal;
  lVar3 = p->timeSat;
  Abc_Print(level,"%s =","SAT solving");
  dVar6 = 0.0;
  if (lVar2 != 0) {
    dVar6 = ((double)lVar3 * 100.0) / (double)lVar2;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)lVar3 / 1000000.0,dVar6);
  lVar2 = p->timeTotal;
  lVar3 = p->timeSatSat;
  Abc_Print(level,"%s =","  sat      ");
  dVar6 = 0.0;
  if (lVar2 != 0) {
    dVar6 = ((double)lVar3 * 100.0) / (double)lVar2;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)lVar3 / 1000000.0,dVar6);
  lVar2 = p->timeTotal;
  lVar3 = p->timeSatUnsat;
  Abc_Print(level,"%s =","  unsat    ");
  dVar6 = 0.0;
  if (lVar2 != 0) {
    dVar6 = ((double)lVar3 * 100.0) / (double)lVar2;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)lVar3 / 1000000.0,dVar6);
  lVar2 = p->timeTotal;
  lVar3 = p->timeSatUndec;
  Abc_Print(level,"%s =","  undecided");
  dVar6 = 0.0;
  if (lVar2 != 0) {
    dVar6 = ((double)lVar3 * 100.0) / (double)lVar2;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)lVar3 / 1000000.0,dVar6);
  lVar2 = p->timeTotal;
  lVar3 = p->timeChoice;
  Abc_Print(level,"%s =","Choice     ");
  dVar6 = 0.0;
  if (lVar2 != 0) {
    dVar6 = ((double)lVar3 * 100.0) / (double)lVar2;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)lVar3 / 1000000.0,dVar6);
  lVar2 = p->timeTotal;
  lVar3 = p->timeOther;
  Abc_Print(level,"%s =","Other      ");
  dVar6 = 0.0;
  if (lVar2 != 0) {
    dVar6 = ((double)lVar3 * 100.0) / (double)lVar2;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)lVar3 / 1000000.0,dVar6);
  lVar2 = p->timeTotal;
  Abc_Print(level,"%s =","TOTAL      ");
  dVar6 = (double)lVar2;
  dVar7 = 0.0;
  if (lVar2 != 0) {
    dVar7 = (dVar6 * 100.0) / dVar6;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar6 / 1000000.0,dVar7);
  lVar2 = p->pPars->timeSynth;
  if (lVar2 != 0) {
    Abc_Print(level,"%s =","Synthesis  ");
    Abc_Print(level,"%9.2f sec\n",(double)lVar2 / 1000000.0);
    return;
  }
  return;
}

Assistant:

void Dch_ManPrintStats( Dch_Man_t * p )
{
    int nNodeNum = Aig_ManNodeNum(p->pAigTotal) / 3;
    Abc_Print( 1, "Parameters: Sim words = %d. Conf limit = %d. SAT var max = %d.\n", 
        p->pPars->nWords, p->pPars->nBTLimit, p->pPars->nSatVarMax );
    Abc_Print( 1, "AIG nodes : Total = %6d. Dangling = %6d. Main = %6d. (%6.2f %%)\n", 
        Aig_ManNodeNum(p->pAigTotal), 
        Aig_ManNodeNum(p->pAigTotal)-nNodeNum,
        nNodeNum,
        100.0 * nNodeNum/Aig_ManNodeNum(p->pAigTotal) );
    Abc_Print( 1, "SAT solver: Vars = %d. Max cone = %d. Recycles = %d.\n", 
        p->nSatVars, p->nConeMax, p->nRecycles );
    Abc_Print( 1, "SAT calls : All = %6d. Unsat = %6d. Sat = %6d. Fail = %6d.\n", 
        p->nSatCalls, p->nSatCalls-p->nSatCallsSat-p->nSatFailsReal, 
        p->nSatCallsSat, p->nSatFailsReal );
    Abc_Print( 1, "Choices   : Lits = %6d. Reprs = %5d. Equivs = %5d. Choices = %5d.\n", 
        p->nLits, p->nReprs, p->nEquivs, p->nChoices );
    Abc_Print( 1, "Choicing runtime statistics:\n" );
    p->timeOther = p->timeTotal-p->timeSimInit-p->timeSimSat-p->timeSat-p->timeChoice;
    Abc_PrintTimeP( 1, "Sim init   ", p->timeSimInit,  p->timeTotal );
    Abc_PrintTimeP( 1, "Sim SAT    ", p->timeSimSat,   p->timeTotal );
    Abc_PrintTimeP( 1, "SAT solving", p->timeSat,      p->timeTotal );
    Abc_PrintTimeP( 1, "  sat      ", p->timeSatSat,   p->timeTotal );
    Abc_PrintTimeP( 1, "  unsat    ", p->timeSatUnsat, p->timeTotal );
    Abc_PrintTimeP( 1, "  undecided", p->timeSatUndec, p->timeTotal );
    Abc_PrintTimeP( 1, "Choice     ", p->timeChoice,   p->timeTotal );
    Abc_PrintTimeP( 1, "Other      ", p->timeOther,    p->timeTotal );
    Abc_PrintTimeP( 1, "TOTAL      ", p->timeTotal,    p->timeTotal );
    if ( p->pPars->timeSynth )
    {
    Abc_PrintTime( 1, "Synthesis  ", p->pPars->timeSynth );
    }
}